

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O0

SoapySDRArgInfo * toArgInfo(ArgInfo *info)

{
  size_t *length;
  char *pcVar1;
  string *s;
  char **ppcVar2;
  long in_RSI;
  SoapySDRArgInfo *in_RDI;
  bad_alloc *anon_var_0;
  size_t namesLength;
  Range *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff90;
  SoapySDRArgInfo *minLength;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  double local_30;
  double dStack_28;
  double local_20;
  
  in_RDI->options = (char **)0x0;
  in_RDI->optionNames = (char **)0x0;
  (in_RDI->range).step = 0.0;
  in_RDI->numOptions = 0;
  (in_RDI->range).minimum = 0.0;
  (in_RDI->range).maximum = 0.0;
  in_RDI->units = (char *)0x0;
  *(undefined8 *)&in_RDI->type = 0;
  in_RDI->name = (char *)0x0;
  in_RDI->description = (char *)0x0;
  in_RDI->key = (char *)0x0;
  in_RDI->value = (char *)0x0;
  minLength = in_RDI;
  length = (size_t *)toCString(in_stack_ffffffffffffff90);
  in_RDI->key = (char *)length;
  pcVar1 = toCString(in_stack_ffffffffffffff90);
  in_RDI->value = pcVar1;
  pcVar1 = toCString(in_stack_ffffffffffffff90);
  in_RDI->name = pcVar1;
  s = (string *)toCString(in_stack_ffffffffffffff90);
  in_RDI->description = (char *)s;
  pcVar1 = toCString(s);
  in_RDI->units = pcVar1;
  in_RDI->type = *(SoapySDRArgInfoType *)(in_RSI + 0xa0);
  toRange(in_stack_ffffffffffffff80);
  (in_RDI->range).step = local_20;
  (in_RDI->range).minimum = local_30;
  (in_RDI->range).maximum = dStack_28;
  ppcVar2 = toStrArray(in_stack_ffffffffffffffc0,length,(size_t)minLength);
  in_RDI->options = ppcVar2;
  ppcVar2 = toStrArray(in_stack_ffffffffffffffc0,length,(size_t)minLength);
  in_RDI->optionNames = ppcVar2;
  return minLength;
}

Assistant:

static inline SoapySDRArgInfo toArgInfo(const SoapySDR::ArgInfo &info)
{
    SoapySDRArgInfo out;
    std::memset(&out, 0, sizeof(out));
    try
    {
        out.key = toCString(info.key);
        out.value = toCString(info.value);
        out.name = toCString(info.name);
        out.description = toCString(info.description);
        out.units = toCString(info.units);
        out.type = SoapySDRArgInfoType(info.type);
        out.range = toRange(info.range);
        out.options = toStrArray(info.options, &out.numOptions);
        size_t namesLength = 0;
        // will be calloc-ed to be at least as long as options to prevent clients from reading garbage
        out.optionNames = toStrArray(info.optionNames, &namesLength, out.numOptions);
    }
    catch (const std::bad_alloc &)
    {
        SoapySDRArgInfo_clear(&out);
        throw;
    }

    return out;
}